

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_unmap_mesh.cpp
# Opt level: O1

Remotes * Omega_h::unmap_owners
                    (Remotes *__return_storage_ptr__,Mesh *old_mesh,Int ent_dim,
                    LOs *new_ents2old_ents,LOs *old_ents2new_ents)

{
  element_type *peVar1;
  int *piVar2;
  void **ppvVar3;
  Library *pLVar4;
  element_type *peVar5;
  undefined8 uVar6;
  Alloc *pAVar7;
  Remotes *this;
  long *plVar8;
  element_type *peVar9;
  Library *pLVar10;
  ScopedTimer omega_h_scoped_function_timer;
  Write<int> new_own_ranks;
  Read<int> old_copies2new_owners;
  Read<int> old_own_ranks;
  Write<int> new_ents2new_owners;
  Dist old_copies2old_owners;
  Dist old_owners2old_copies;
  ScopedTimer local_249;
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  element_type *local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_200;
  LOs local_1f8;
  LOs local_1e8;
  Write<int> local_1d8;
  Write<int> local_1c8;
  Read<int> local_1b8;
  Read<int> local_1a8;
  Alloc *local_198;
  void *local_190;
  Remotes *local_188;
  Read<signed_char> local_180;
  Read<signed_char> local_170;
  Alloc *local_160;
  void *local_158;
  undefined1 local_150 [24];
  void *pvStack_138;
  undefined1 local_c0 [24];
  void *pvStack_a8;
  
  local_248._0_8_ = local_248 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_unmap_mesh.cpp"
             ,"");
  plVar8 = (long *)std::__cxx11::string::append(local_248);
  peVar5 = (element_type *)(local_c0 + 0x10);
  peVar9 = (element_type *)(plVar8 + 2);
  if ((element_type *)*plVar8 == peVar9) {
    local_c0._16_8_ = peVar9->library_;
    pvStack_a8 = (void *)plVar8[3];
    local_c0._0_8_ = peVar5;
  }
  else {
    local_c0._16_8_ = peVar9->library_;
    local_c0._0_8_ = (element_type *)*plVar8;
  }
  local_c0._8_8_ = plVar8[1];
  *plVar8 = (long)peVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  peVar9 = (element_type *)(local_228 + 0x10);
  local_228._0_8_ = peVar9;
  local_188 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)local_228,'\x02');
  *(undefined2 *)(Library **)local_228._0_8_ = 0x3035;
  pLVar4 = (Library *)((long)(_func_int ***)local_c0._8_8_ + local_228._8_8_);
  pLVar10 = (Library *)0xf;
  if ((element_type *)local_c0._0_8_ != peVar5) {
    pLVar10 = (Library *)local_c0._16_8_;
  }
  if (pLVar10 < pLVar4) {
    pLVar10 = (Library *)0xf;
    if ((element_type *)local_228._0_8_ != peVar9) {
      pLVar10 = (Library *)local_228._16_8_;
    }
    if (pLVar4 <= pLVar10) {
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,local_c0._0_8_);
      goto LAB_00417ff8;
    }
  }
  plVar8 = (long *)std::__cxx11::string::_M_append(local_c0,local_228._0_8_);
LAB_00417ff8:
  local_150._0_8_ = local_150 + 0x10;
  peVar1 = (element_type *)(plVar8 + 2);
  if ((element_type *)*plVar8 == peVar1) {
    local_150._16_8_ = peVar1->library_;
    pvStack_138 = (void *)plVar8[3];
  }
  else {
    local_150._16_8_ = peVar1->library_;
    local_150._0_8_ = (element_type *)*plVar8;
  }
  local_150._8_8_ = plVar8[1];
  *plVar8 = (long)peVar1;
  plVar8[1] = 0;
  *(undefined1 *)&peVar1->library_ = 0;
  begin_code("unmap_owners",(char *)local_150._0_8_);
  if ((element_type *)local_150._0_8_ != (element_type *)(local_150 + 0x10)) {
    operator_delete((void *)local_150._0_8_,(ulong)((long)(LO *)local_150._16_8_ + 1));
  }
  if ((element_type *)local_228._0_8_ != peVar9) {
    operator_delete((void *)local_228._0_8_,(ulong)((long)(LO *)local_228._16_8_ + 1));
  }
  if ((element_type *)local_c0._0_8_ != peVar5) {
    operator_delete((void *)local_c0._0_8_,(ulong)((long)(LO *)local_c0._16_8_ + 1));
  }
  if ((element_type *)local_248._0_8_ != (element_type *)(local_248 + 0x10)) {
    operator_delete((void *)local_248._0_8_,(ulong)((long)(size_t *)local_248._16_8_ + 1));
  }
  Mesh::ask_dist((Dist *)local_150,old_mesh,ent_dim);
  Dist::invert((Dist *)local_c0,(Dist *)local_150);
  local_160 = (old_ents2new_ents->write_).shared_alloc_.alloc;
  if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_160 = (Alloc *)(local_160->size * 8 + 1);
    }
    else {
      local_160->use_count = local_160->use_count + 1;
    }
  }
  local_158 = (old_ents2new_ents->write_).shared_alloc_.direct_ptr;
  Dist::exch<int>((Dist *)local_228,(Read<int> *)local_c0,(Int)&local_160);
  pAVar7 = local_160;
  if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
    piVar2 = &local_160->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_160);
      operator_delete(pAVar7,0x48);
    }
  }
  local_1e8.write_.shared_alloc_.alloc = (new_ents2old_ents->write_).shared_alloc_.alloc;
  if (((ulong)local_1e8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1e8.write_.shared_alloc_.alloc =
           (Alloc *)((local_1e8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1e8.write_.shared_alloc_.alloc)->use_count =
           (local_1e8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1e8.write_.shared_alloc_.direct_ptr = (new_ents2old_ents->write_).shared_alloc_.direct_ptr;
  local_1a8.write_.shared_alloc_.alloc = (Alloc *)local_228._0_8_;
  if ((local_228._0_8_ & 7) == 0 && (element_type *)local_228._0_8_ != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_1a8.write_.shared_alloc_.alloc = (Alloc *)((long)*(Library **)local_228._0_8_ * 8 + 1);
    }
    else {
      ppvVar3 = &(((HostRead<int> *)(local_228._0_8_ + 0x28))->read_).write_.shared_alloc_.
                 direct_ptr;
      *(int *)ppvVar3 = *(int *)ppvVar3 + 1;
    }
  }
  local_1a8.write_.shared_alloc_.direct_ptr = (void *)local_228._8_8_;
  unmap<int>((Omega_h *)&local_198,&local_1e8,&local_1a8,1);
  pAVar7 = local_1a8.write_.shared_alloc_.alloc;
  if (((ulong)local_1a8.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_1a8.write_.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar3 = &(((HostRead<int> *)&(local_1a8.write_.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
    if (*(int *)ppvVar3 == 0) {
      Alloc::~Alloc(pAVar7);
      operator_delete(pAVar7,0x48);
    }
  }
  pAVar7 = local_1e8.write_.shared_alloc_.alloc;
  if (((ulong)local_1e8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_1e8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_1e8.write_.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
    }
  }
  Mesh::ask_owners((Remotes *)local_248,old_mesh,ent_dim);
  this = local_188;
  local_208 = (element_type *)local_248._0_8_;
  local_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._8_8_;
  if (((local_248._0_8_ & 7) == 0 && (element_type *)local_248._0_8_ != (element_type *)0x0) &&
     (entering_parallel == '\x01')) {
    ppvVar3 = &(((HostRead<int> *)(local_248._0_8_ + 0x28))->read_).write_.shared_alloc_.direct_ptr;
    *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
    local_208 = (element_type *)((long)*(Library **)local_248._0_8_ * 8 + 1);
  }
  local_248._0_8_ = (Alloc *)0x0;
  local_248._8_8_ = (void *)0x0;
  if ((local_248._16_8_ & 7) == 0 && (Alloc *)local_248._16_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_248._16_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_248._16_8_);
      operator_delete((void *)local_248._16_8_,0x48);
    }
  }
  uVar6 = local_248._0_8_;
  if ((local_248._0_8_ & 7) == 0 && (Alloc *)local_248._0_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_248._0_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_248._0_8_);
      operator_delete((void *)uVar6,0x48);
    }
  }
  local_1f8.write_.shared_alloc_.alloc = (new_ents2old_ents->write_).shared_alloc_.alloc;
  if (((ulong)local_1f8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1f8.write_.shared_alloc_.alloc =
           (Alloc *)((local_1f8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1f8.write_.shared_alloc_.alloc)->use_count =
           (local_1f8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_1f8.write_.shared_alloc_.direct_ptr = (new_ents2old_ents->write_).shared_alloc_.direct_ptr;
  local_1b8.write_.shared_alloc_.alloc = (Alloc *)local_208;
  if (((ulong)local_208 & 7) == 0 && local_208 != (element_type *)0x0) {
    if (entering_parallel == '\x01') {
      local_1b8.write_.shared_alloc_.alloc = (Alloc *)((long)local_208->library_ * 8 + 1);
    }
    else {
      ppvVar3 = &(local_208->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
      *(int *)ppvVar3 = *(int *)ppvVar3 + 1;
    }
  }
  local_1b8.write_.shared_alloc_.direct_ptr = local_200;
  unmap<int>((Omega_h *)local_248,&local_1f8,&local_1b8,1);
  pAVar7 = local_1b8.write_.shared_alloc_.alloc;
  if (((ulong)local_1b8.write_.shared_alloc_.alloc & 7) == 0 &&
      (element_type *)local_1b8.write_.shared_alloc_.alloc != (element_type *)0x0) {
    ppvVar3 = &(((HostRead<int> *)&(local_1b8.write_.shared_alloc_.alloc)->ptr)->read_).write_.
               shared_alloc_.direct_ptr;
    *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
    if (*(int *)ppvVar3 == 0) {
      Alloc::~Alloc(pAVar7);
      operator_delete(pAVar7,0x48);
    }
  }
  pAVar7 = local_1f8.write_.shared_alloc_.alloc;
  if (((ulong)local_1f8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_1f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_1f8.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_1f8.write_.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
    }
  }
  local_1c8.shared_alloc_.alloc = (Alloc *)local_248._0_8_;
  if ((local_248._0_8_ & 7) == 0 && (Alloc *)local_248._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1c8.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_248._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_248._0_8_ + 0x30) = *(int *)(local_248._0_8_ + 0x30) + 1;
    }
  }
  local_1c8.shared_alloc_.direct_ptr = (void *)local_248._8_8_;
  Read<int>::Read(&local_170,&local_1c8);
  local_1d8.shared_alloc_.alloc = local_198;
  if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_1d8.shared_alloc_.alloc = (Alloc *)(local_198->size * 8 + 1);
    }
    else {
      local_198->use_count = local_198->use_count + 1;
    }
  }
  local_1d8.shared_alloc_.direct_ptr = local_190;
  Read<int>::Read(&local_180,&local_1d8);
  Remotes::Remotes(this,(Read<int> *)&local_170,(LOs *)&local_180);
  if (((ulong)local_180.write_.shared_alloc_.alloc & 7) == 0 &&
      local_180.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_180.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_180.write_.shared_alloc_.alloc);
      operator_delete(local_180.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar7 = local_1d8.shared_alloc_.alloc;
  if (((ulong)local_1d8.shared_alloc_.alloc & 7) == 0 &&
      local_1d8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_1d8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_1d8.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
    }
  }
  if (((ulong)local_170.write_.shared_alloc_.alloc & 7) == 0 &&
      local_170.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_170.write_.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_170.write_.shared_alloc_.alloc);
      operator_delete(local_170.write_.shared_alloc_.alloc,0x48);
    }
  }
  pAVar7 = local_1c8.shared_alloc_.alloc;
  if (((ulong)local_1c8.shared_alloc_.alloc & 7) == 0 &&
      local_1c8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar2 = &(local_1c8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_1c8.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
    }
  }
  uVar6 = local_248._0_8_;
  if ((local_248._0_8_ & 7) == 0 && (Alloc *)local_248._0_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_248._0_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_248._0_8_);
      operator_delete((void *)uVar6,0x48);
    }
  }
  peVar5 = local_208;
  if (((ulong)local_208 & 7) == 0 && local_208 != (element_type *)0x0) {
    ppvVar3 = &(local_208->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
    *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
    if (*(int *)ppvVar3 == 0) {
      Alloc::~Alloc((Alloc *)peVar5);
      operator_delete(peVar5,0x48);
    }
  }
  if (((ulong)local_198 & 7) == 0 && local_198 != (Alloc *)0x0) {
    piVar2 = &local_198->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_198);
      operator_delete(local_198,0x48);
    }
  }
  uVar6 = local_228._0_8_;
  if ((local_228._0_8_ & 7) == 0 && (element_type *)local_228._0_8_ != (element_type *)0x0) {
    ppvVar3 = &(((HostRead<int> *)(local_228._0_8_ + 0x28))->read_).write_.shared_alloc_.direct_ptr;
    *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
    if (*(int *)ppvVar3 == 0) {
      Alloc::~Alloc((Alloc *)local_228._0_8_);
      operator_delete((void *)uVar6,0x48);
    }
  }
  Dist::~Dist((Dist *)local_c0);
  Dist::~Dist((Dist *)local_150);
  ScopedTimer::~ScopedTimer(&local_249);
  return this;
}

Assistant:

Remotes unmap_owners(
    Mesh* old_mesh, Int ent_dim, LOs new_ents2old_ents, LOs old_ents2new_ents) {
  OMEGA_H_TIME_FUNCTION;
  auto old_copies2old_owners = old_mesh->ask_dist(ent_dim);
  auto old_owners2old_copies = old_copies2old_owners.invert();
  auto old_copies2new_owners = old_owners2old_copies.exch(old_ents2new_ents, 1);
  auto new_ents2new_owners = unmap(new_ents2old_ents, old_copies2new_owners, 1);
  auto old_own_ranks = old_mesh->ask_owners(ent_dim).ranks;
  auto new_own_ranks = unmap(new_ents2old_ents, old_own_ranks, 1);
  return Remotes(new_own_ranks, new_ents2new_owners);
}